

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall CConnman::AcceptConnection(CConnman *this,ListenSocket *hListenSocket)

{
  long lVar1;
  element_type *peVar2;
  CService ipIn;
  CService ipIn_00;
  bool bVar3;
  int *piVar4;
  pointer *__ptr;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  _Head_base<0UL,_Sock_*,_false> local_1a8;
  undefined4 uStack_1a0;
  socklen_t len;
  CAddress local_198;
  CService local_160;
  CService local_138;
  CAddress addr_bind;
  CAddress addr;
  sockaddr_storage sockaddr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  len = 0x80;
  peVar2 = (hListenSocket->sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar2->_vptr_Sock[8])(&local_1a8,peVar2,&sockaddr);
  CAddress::CAddress(&addr);
  if (local_1a8._M_head_impl == (Sock *)0x0) {
    piVar4 = __errno_location();
    if (*piVar4 != 0xb) {
      NetworkErrorString_abi_cxx11_((string *)&addr_bind,*piVar4);
      logging_function._M_str = "AcceptConnection";
      logging_function._M_len = 0x10;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
      source_file._M_len = 0x50;
      ::LogPrintf_<std::__cxx11::string>
                (logging_function,source_file,0x6ae,ALL,Info,"socket error accept failed: %s\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr_bind);
      std::__cxx11::string::~string((string *)&addr_bind);
    }
  }
  else {
    bVar3 = CService::SetSockAddr(&addr.super_CService,(sockaddr *)&sockaddr);
    if (bVar3) {
      MaybeFlipIPv6toCJDNS(&local_138,&addr.super_CService);
      ipIn.super_CNetAddr.m_addr._union.indirect_contents.capacity = uStack_1a0;
      ipIn.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)local_1a8._M_head_impl;
      ipIn.super_CNetAddr.m_addr._union._12_4_ = len;
      ipIn._16_24_ = local_198.super_CService.super_CNetAddr.m_addr;
      CAddress::CAddress(&addr_bind,ipIn,(ServiceFlags)&local_138);
      CAddress::operator=(&addr,&addr_bind);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr_bind);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_138);
    }
    else {
      bVar3 = ::LogAcceptCategory(NET,Warning);
      if (bVar3) {
        logging_function_00._M_str = "AcceptConnection";
        logging_function_00._M_len = 0x10;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
        source_file_00._M_len = 0x50;
        ::LogPrintf_<>(logging_function_00,source_file_00,0x6b4,NET,Warning,
                       "Unknown socket family\n");
      }
    }
    GetBindAddress(&local_198,local_1a8._M_head_impl);
    MaybeFlipIPv6toCJDNS(&local_160,&local_198.super_CService);
    ipIn_00.super_CNetAddr.m_addr._union.indirect_contents.capacity = uStack_1a0;
    ipIn_00.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)local_1a8._M_head_impl
    ;
    ipIn_00.super_CNetAddr.m_addr._union._12_4_ = len;
    ipIn_00._16_24_ = local_198.super_CService.super_CNetAddr.m_addr;
    CAddress::CAddress(&addr_bind,ipIn_00,(ServiceFlags)&local_160);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_160);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_198);
    CreateNodeFromAcceptedSocket
              (this,(unique_ptr<Sock,_std::default_delete<Sock>_> *)&local_1a8,
               hListenSocket->m_permissions,&addr_bind,&addr);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr_bind);
  }
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
  if (local_1a8._M_head_impl != (Sock *)0x0) {
    (*(local_1a8._M_head_impl)->_vptr_Sock[1])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::AcceptConnection(const ListenSocket& hListenSocket) {
    struct sockaddr_storage sockaddr;
    socklen_t len = sizeof(sockaddr);
    auto sock = hListenSocket.sock->Accept((struct sockaddr*)&sockaddr, &len);
    CAddress addr;

    if (!sock) {
        const int nErr = WSAGetLastError();
        if (nErr != WSAEWOULDBLOCK) {
            LogPrintf("socket error accept failed: %s\n", NetworkErrorString(nErr));
        }
        return;
    }

    if (!addr.SetSockAddr((const struct sockaddr*)&sockaddr)) {
        LogPrintLevel(BCLog::NET, BCLog::Level::Warning, "Unknown socket family\n");
    } else {
        addr = CAddress{MaybeFlipIPv6toCJDNS(addr), NODE_NONE};
    }

    const CAddress addr_bind{MaybeFlipIPv6toCJDNS(GetBindAddress(*sock)), NODE_NONE};

    NetPermissionFlags permission_flags = NetPermissionFlags::None;
    hListenSocket.AddSocketPermissionFlags(permission_flags);

    CreateNodeFromAcceptedSocket(std::move(sock), permission_flags, addr_bind, addr);
}